

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enter.hpp
# Opt level: O2

void __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::computeDualfarkas4Row
          (SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *direction,SPxId enterId)

{
  ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
  *this_00;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *this_01;
  type_conflict5 tVar1;
  int iVar2;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar3;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar4;
  int j;
  long lVar5;
  byte bVar6;
  uint uVar7;
  int local_1d8;
  SPxId spxid;
  SPxId enterId_local;
  DataKey local_1c0;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sign;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar6 = 0;
  result.m_backend.data._M_elems._0_8_ = result.m_backend.data._M_elems._0_8_ & 0xffffffff00000000;
  enterId_local = enterId;
  tVar1 = boost::multiprecision::operator>(direction,(int *)&result);
  if (tVar1) {
    uVar7 = 0xbff00000;
  }
  else {
    uVar7 = 0x3ff00000;
  }
  boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
            (&sign.m_backend,(double)((ulong)uVar7 << 0x20),(type *)0x0);
  (this->dualFarkas).
  super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  .memused = 0;
  this_01 = &this->dualFarkas;
  DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setMax(this_01,(this->theFvec->thedelta).super_IdxSet.num + 1);
  this_00 = &(this->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set;
  for (lVar5 = 0; lVar5 < (this->theFvec->thedelta).super_IdxSet.num; lVar5 = lVar5 + 1) {
    spxid.super_DataKey =
         (this->
         super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).theBaseId.data[(this->theFvec->thedelta).super_IdxSet.idx[lVar5]].super_DataKey;
    if (spxid.super_DataKey.info < 0) {
      SPxRowId::SPxRowId((SPxRowId *)&local_1c0,&spxid);
      iVar2 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
              ::number(this_00,&local_1c0);
      SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::value((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_b0,&this->theFvec->thedelta,(int)lVar5);
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&sign.m_backend,&local_b0);
      DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
      ::add(this_01,iVar2,
            (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
             *)&result.m_backend);
    }
  }
  local_1d8 = enterId.super_DataKey.info;
  if (local_1d8 < 0) {
    SPxRowId::SPxRowId((SPxRowId *)&local_b0,&enterId_local);
    iVar2 = ClassSet<soplex::SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::DLPSV>
            ::number(this_00,(DataKey *)&local_b0);
    pnVar3 = &sign;
    pnVar4 = &result;
    for (lVar5 = 0x1c; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pnVar4->m_backend).data._M_elems[0] = (pnVar3->m_backend).data._M_elems[0];
      pnVar3 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar3 + ((ulong)bVar6 * -2 + 1) * 4);
      pnVar4 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar4 + ((ulong)bVar6 * -2 + 1) * 4);
    }
    result.m_backend.exp = sign.m_backend.exp;
    result.m_backend.neg = sign.m_backend.neg;
    result.m_backend.fpclass = sign.m_backend.fpclass;
    result.m_backend.prec_elem = sign.m_backend.prec_elem;
    if (sign.m_backend.fpclass != cpp_dec_float_finite || result.m_backend.data._M_elems[0] != 0) {
      result.m_backend.neg = (bool)(sign.m_backend.neg ^ 1);
    }
    DSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::add(this_01,iVar2,&result);
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeDualfarkas4Row(R direction, SPxId enterId)
{
   R sign = (direction > 0 ? -1.0 : 1.0);

   dualFarkas.clear();
   dualFarkas.setMax(fVec().delta().size() + 1);

   for(int j = 0; j < fVec().delta().size(); ++j)
   {
      SPxId spxid = this->baseId(fVec().idx().index(j));

      if(spxid.isSPxRowId())
         dualFarkas.add(this->number(SPxRowId(spxid)), sign * fVec().delta().value(j));
   }

   if(enterId.isSPxRowId())
      dualFarkas.add(this->number(SPxRowId(enterId)), -sign);
}